

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.c
# Opt level: O2

void delete_ast_compound_statement(AST_Compound_Statement *compound_statement)

{
  AST *ast;
  
  if (compound_statement->scope != (Scope *)0x0) {
    delete_scope(compound_statement->scope);
  }
  while ((compound_statement->components).size != 0) {
    ast = (AST *)Queue_Pop(&compound_statement->components);
    delete_ast(ast);
  }
  free(compound_statement);
  return;
}

Assistant:

void delete_ast_compound_statement(struct AST_Compound_Statement *compound_statement)
{
	if(compound_statement->scope!=NULL)
		delete_scope(compound_statement->scope);
	while(compound_statement->components.size>0)
		delete_ast((struct AST*)Queue_Pop(&compound_statement->components));
	free(compound_statement);
}